

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ActivationELU * __thiscall
CoreML::Specification::ActivationParams::mutable_elu(ActivationParams *this)

{
  bool bVar1;
  ActivationELU *this_00;
  ActivationParams *this_local;
  
  bVar1 = has_elu(this);
  if (!bVar1) {
    clear_NonlinearityType(this);
    set_has_elu(this);
    this_00 = (ActivationELU *)operator_new(0x18);
    ActivationELU::ActivationELU(this_00);
    (this->NonlinearityType_).elu_ = this_00;
  }
  return (ActivationELU *)(this->NonlinearityType_).linear_;
}

Assistant:

inline ::CoreML::Specification::ActivationELU* ActivationParams::mutable_elu() {
  if (!has_elu()) {
    clear_NonlinearityType();
    set_has_elu();
    NonlinearityType_.elu_ = new ::CoreML::Specification::ActivationELU;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.ActivationParams.ELU)
  return NonlinearityType_.elu_;
}